

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLayerNormalizationNoGammaOrBeta(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_long> *this;
  RepeatedField<float> *this_00;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  LayerNormalizationLayerParams *pLVar15;
  ostream *poVar16;
  string *psVar17;
  long lVar18;
  WeightParams *pWVar19;
  float *pfVar20;
  undefined8 *puVar21;
  int iVar22;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar23;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  uint32_t size;
  uint uVar24;
  Arena *pAVar25;
  Model m;
  Result res2;
  Result res1;
  Model local_a0;
  Result local_70;
  Result local_48;
  
  CoreML::Specification::Model::Model(&local_a0,(Arena *)0x0,false);
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pAVar25 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    local_a0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar25);
  }
  pRVar4 = ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bc21d:
    pRVar23 = &(local_a0.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar23->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar23->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar22 = ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001bc21d;
    ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar21);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar25);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar24 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar24] = 5;
  uVar24 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar24] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pAVar25 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    local_a0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar25);
  }
  pRVar4 = ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bc389:
    pRVar23 = &(local_a0.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar23->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar23->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar22 = ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001bc389;
    ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"output",puVar21);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar25);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar24 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar24] = 5;
  uVar24 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar24] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (local_a0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_a0);
    local_a0._oneof_case_[0] = 500;
    pAVar25 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    local_a0.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar25);
  }
  (local_a0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_a0.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bc510:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_a0.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar12);
  }
  else {
    iVar22 = (local_a0.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001bc510;
    (local_a0.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar22 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar22];
  }
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bc548:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar22 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001bc548;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bc598:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar22 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001bc598;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3dece7);
  if (pNVar12->_oneof_case_[0] != 0x546) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x546;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pLVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::LayerNormalizationLayerParams>(pAVar25);
    (pNVar12->layer_).layernormalization_ = pLVar15;
  }
  pCVar6 = (pNVar12->layer_).convolution_;
  this = &pCVar6->kernelsize_;
  uVar2 = (pCVar6->kernelsize_).current_size_;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar10[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  CoreML::validate<(MLModelType)500>(&local_48,&local_a0);
  bVar7 = CoreML::Result::good(&local_48);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  else {
    psVar17 = CoreML::Result::message_abi_cxx11_(&local_48);
    lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b90e5,0);
    if (lVar18 != -1) {
      lVar18._0_4_ = (pCVar6->stride_).current_size_;
      lVar18._4_4_ = (pCVar6->stride_).total_size_;
      if (lVar18 == 0) {
        uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
        pAVar25 = (Arena *)(uVar5 & 0xfffffffffffffffc);
        if ((uVar5 & 1) != 0) {
          pAVar25 = *(Arena **)pAVar25;
        }
        pWVar19 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar25);
        *(WeightParams **)&pCVar6->stride_ = pWVar19;
      }
      lVar18 = *(long *)&pCVar6->stride_;
      this_00 = (RepeatedField<float> *)(lVar18 + 0x10);
      uVar2 = *(uint *)(lVar18 + 0x10);
      if (uVar2 == *(uint *)(lVar18 + 0x14)) {
        google::protobuf::RepeatedField<float>::Reserve(this_00,*(uint *)(lVar18 + 0x14) + 1);
      }
      pfVar20 = google::protobuf::RepeatedField<float>::elements(this_00);
      pfVar20[uVar2] = 1.0;
      this_00->current_size_ = uVar2 + 1;
      CoreML::validate<(MLModelType)500>(&local_70,&local_a0);
      bVar7 = CoreML::Result::good(&local_70);
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
LAB_001bc9a5:
        std::ostream::put((char)poVar16);
        iVar22 = 1;
        std::ostream::flush();
      }
      else {
        psVar17 = CoreML::Result::message_abi_cxx11_(&local_70);
        iVar22 = 0;
        lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b911d,0);
        if (lVar18 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"res2.message().find(\"Beta\") != std::string::npos",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          goto LAB_001bc9a5;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
        operator_delete(local_70.m_message._M_dataplus._M_p,
                        local_70.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001bc9d8;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"res1.message().find(\"Gamma\") != std::string::npos",0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  std::ostream::put((char)poVar16);
  iVar22 = 1;
  std::ostream::flush();
LAB_001bc9d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_a0);
  return iVar22;
}

Assistant:

int testInvalidLayerNormalizationNoGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    // not specifying the gamma parameter
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Gamma") != std::string::npos);

    // not specifying the beta parameter
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("Beta") != std::string::npos);

    return 0;

}